

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  string local_60;
  string local_40;
  
  if (_DAT_0015e5e8 != 0) {
    lVar1 = std::__cxx11::string::find(-0x20,0x3a);
    if (lVar1 == -1) {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             FLAGS_gtest_stream_result_to_abi_cxx11_);
      fflush(_stdout);
      return;
    }
    this_00 = (StreamingListener *)operator_new(0x10);
    std::__cxx11::string::substr((ulong)&local_60,0x15e5e0);
    std::__cxx11::string::substr((ulong)&local_40,0x15e5e0);
    StreamingListener::StreamingListener(this_00,&local_60,&local_40);
    TestEventRepeater::Append((this->listeners_).repeater_,(TestEventListener *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result,
    const char* expression_text,
    const char* actual_predicate_value,
    const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}